

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O1

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* lest::split_option(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *__return_storage_ptr__,text *arg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar3;
  long lVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  size_type *psVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_138;
  size_type local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  ulong *local_118;
  undefined8 local_110;
  ulong local_108;
  undefined8 uStack_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  lVar4 = std::__cxx11::string::rfind((char)arg,0x3d);
  if (lVar4 == -1) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    local_38._M_string_length = 0;
    local_38.field_2._M_local_buf[0] = '\0';
    std::make_pair<std::__cxx11::string&,std::__cxx11::string>(&local_b8,arg,&local_38);
    local_138 = &local_128;
    paVar1 = &local_b8.first.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8.first._M_dataplus._M_p == paVar1) {
      local_128._8_8_ = local_b8.first.field_2._8_8_;
    }
    else {
      local_138 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8.first._M_dataplus._M_p;
    }
    local_128._M_allocated_capacity._1_7_ = local_b8.first.field_2._M_allocated_capacity._1_7_;
    local_128._M_local_buf[0] = local_b8.first.field_2._M_local_buf[0];
    paVar5 = &local_b8.second.field_2;
    local_118 = &local_108;
    local_130 = local_b8.first._M_string_length;
    local_b8.first._M_string_length = 0;
    local_b8.first.field_2._M_local_buf[0] = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8.second._M_dataplus._M_p == paVar5) {
      uStack_100 = local_b8.second.field_2._8_8_;
    }
    else {
      local_118 = (ulong *)local_b8.second._M_dataplus._M_p;
    }
    local_108 = local_b8.second.field_2._M_allocated_capacity;
    ppVar3 = &local_b8;
    local_b8.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    std::__cxx11::string::substr((ulong)&local_d8,(ulong)arg);
    std::__cxx11::string::substr((ulong)&local_f8,(ulong)arg);
    std::make_pair<std::__cxx11::string,std::__cxx11::string>(&local_78,&local_d8,&local_f8);
    local_138 = &local_128;
    paVar1 = &local_78.first.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.first._M_dataplus._M_p == paVar1) {
      local_128._8_8_ = local_78.first.field_2._8_8_;
    }
    else {
      local_138 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_78.first._M_dataplus._M_p;
    }
    local_128._M_allocated_capacity._1_7_ = local_78.first.field_2._M_allocated_capacity._1_7_;
    local_128._M_local_buf[0] = local_78.first.field_2._M_local_buf[0];
    paVar5 = &local_78.second.field_2;
    local_118 = &local_108;
    local_130 = local_78.first._M_string_length;
    local_78.first._M_dataplus._M_p = (pointer)paVar1;
    local_78.first._M_string_length = 0;
    local_78.first.field_2._M_local_buf[0] = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.second._M_dataplus._M_p == paVar5) {
      uStack_100 = local_78.second.field_2._8_8_;
    }
    else {
      local_118 = (ulong *)local_78.second._M_dataplus._M_p;
    }
    local_108 = local_78.second.field_2._M_allocated_capacity;
    ppVar3 = &local_78;
  }
  psVar6 = &(ppVar3->second)._M_string_length;
  sVar2 = *psVar6;
  (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(psVar6 + -1))->_M_dataplus
  )._M_p = (pointer)paVar5;
  *psVar6 = 0;
  paVar5->_M_local_buf[0] = '\0';
  paVar1 = &(__return_storage_ptr__->first).field_2;
  (__return_storage_ptr__->first)._M_dataplus._M_p = (pointer)paVar1;
  if (local_138 == &local_128) {
    paVar1->_M_allocated_capacity = local_128._M_allocated_capacity;
    *(undefined8 *)((long)&(__return_storage_ptr__->first).field_2 + 8) = local_128._8_8_;
  }
  else {
    (__return_storage_ptr__->first)._M_dataplus._M_p = (pointer)local_138;
    (__return_storage_ptr__->first).field_2._M_allocated_capacity = local_128._M_allocated_capacity;
  }
  (__return_storage_ptr__->first)._M_string_length = local_130;
  local_128._M_allocated_capacity = local_128._M_allocated_capacity & 0xffffffffffffff00;
  paVar1 = &(__return_storage_ptr__->second).field_2;
  (__return_storage_ptr__->second)._M_dataplus._M_p = (pointer)paVar1;
  if (local_118 == &local_108) {
    paVar1->_M_allocated_capacity = local_108;
    *(undefined8 *)((long)&(__return_storage_ptr__->second).field_2 + 8) = uStack_100;
  }
  else {
    (__return_storage_ptr__->second)._M_dataplus._M_p = (pointer)local_118;
    (__return_storage_ptr__->second).field_2._M_allocated_capacity = local_108;
  }
  (__return_storage_ptr__->second)._M_string_length = sVar2;
  local_108 = local_108 & 0xffffffffffffff00;
  local_110 = 0;
  local_118 = &local_108;
  if (lVar4 == -1) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8.second._M_dataplus._M_p != &local_b8.second.field_2) {
      operator_delete(local_b8.second._M_dataplus._M_p,
                      local_b8.second.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8.first._M_dataplus._M_p != &local_b8.first.field_2) {
      operator_delete(local_b8.first._M_dataplus._M_p,
                      CONCAT71(local_b8.first.field_2._M_allocated_capacity._1_7_,
                               local_b8.first.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p == &local_38.field_2) {
      return __return_storage_ptr__;
    }
    local_d8.field_2._M_allocated_capacity =
         CONCAT71(local_38.field_2._M_allocated_capacity._1_7_,local_38.field_2._M_local_buf[0]);
    local_d8._M_dataplus._M_p = local_38._M_dataplus._M_p;
  }
  else {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.second._M_dataplus._M_p != &local_78.second.field_2) {
      operator_delete(local_78.second._M_dataplus._M_p,
                      local_78.second.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.first._M_dataplus._M_p != &local_78.first.field_2) {
      operator_delete(local_78.first._M_dataplus._M_p,
                      CONCAT71(local_78.first.field_2._M_allocated_capacity._1_7_,
                               local_78.first.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p == &local_d8.field_2) {
      return __return_storage_ptr__;
    }
  }
  operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

inline std::pair<text, text>
split_option( text arg )
{
    text::size_type pos = arg.rfind( '=' );

    return pos == text::npos
                ? std::make_pair( arg, text() )
                : std::make_pair( arg.substr( 0, pos ), arg.substr( pos + 1 ) );
}